

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O1

void dummy_CheckIfTypeIsEquivalent(void)

{
  return;
}

Assistant:

bool JavascriptNativeOperators::CheckIfPolyTypeIsEquivalent(Type* type, JitPolyEquivalentTypeGuard* guard, uint8 index)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(CheckIfPolyTypeIsEquivalent, reentrancylock, type->GetScriptContext()->GetThreadContext());
        bool result = EquivalenceCheckHelper(type, guard, guard->GetPolyValue(index));
        if (result)
        {
            guard->SetPolyValue((intptr_t)type, index);
        }
        return result;
        JIT_HELPER_END(CheckIfPolyTypeIsEquivalent);
    }